

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall testing::internal::MatchMatrix::NextGraph(MatchMatrix *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = *(ulong *)this;
  if (uVar4 != 0) {
    uVar3 = *(ulong *)(this + 8);
    uVar1 = 0;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar4 = 0;
        do {
          lVar2 = uVar3 * uVar1 + *(long *)(this + 0x10);
          bVar5 = *(char *)(uVar4 + lVar2) == '\0';
          *(bool *)(uVar4 + lVar2) = bVar5;
          if (bVar5) {
            return true;
          }
          uVar4 = uVar4 + 1;
          uVar3 = *(ulong *)(this + 8);
        } while (uVar4 < uVar3);
        uVar4 = *(ulong *)this;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < uVar4);
  }
  return false;
}

Assistant:

size_t LhsSize() const { return num_elements_; }